

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_iterator __position;
  iterator __n;
  bson_container_type bVar4;
  bson_container_type *in_RDI;
  uint8_t in_stack_0000004f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  unsigned_long *in_stack_ffffffffffffff90;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_01;
  undefined4 in_stack_ffffffffffffffa0;
  uint7 in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  
  bVar4 = in_RDI[0x24] + array;
  in_RDI[0x24] = bVar4;
  iVar2 = bson_options_common::max_nesting_depth
                    ((bson_options_common *)
                     ((long)in_RDI + *(long *)(*(undefined8 *)(in_RDI + 0x10) - 0x18) + 0x40));
  if (iVar2 < (int)bVar4) {
    std::error_code::operator=
              ((error_code *)CONCAT44(bVar4,in_stack_ffffffffffffffa0),
               (bson_errc)((ulong)in_RDI >> 0x20));
  }
  else {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x1e));
    if (sVar3 != 0) {
      bVar1 = std::
              vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
              ::empty((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                       *)CONCAT44(bVar4,in_stack_ffffffffffffffa0));
      if (bVar1) {
        std::error_code::operator=
                  ((error_code *)CONCAT44(bVar4,in_stack_ffffffffffffffa0),
                   (bson_errc)((ulong)in_RDI >> 0x20));
        return true;
      }
      before_value((basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)ec,
                   in_stack_0000004f);
    }
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x18);
    __position._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x1e));
    std::
    vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::bson::bson_container_type,unsigned_long>
              ((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                *)CONCAT44(bVar4,in_stack_ffffffffffffffa0),in_RDI,in_stack_ffffffffffffff90);
    this_01 = (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)(in_RDI + 0x1e);
    __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (this_01,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (in_stack_ffffffffffffffc0,__position,(size_type)__n._M_current,
               (value_type_conflict *)(ulong)in_stack_ffffffffffffffb0);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        if (buffer_.size() > 0)
        {
            if (stack_.empty())
            {
                ec = bson_errc::expected_bson_document;
                JSONCONS_VISITOR_RETURN;
            }
            before_value(jsoncons::bson::bson_type::document_type);
        }

        stack_.emplace_back(jsoncons::bson::bson_container_type::document, buffer_.size());
        buffer_.insert(buffer_.end(), sizeof(int32_t), 0);

        JSONCONS_VISITOR_RETURN;
    }